

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,unsigned_short *args,uchar *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  Printer *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  uchar x;
  string *local_f0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_cd [13];
  string *local_c0;
  string local_b8;
  string local_98;
  string local_78;
  iterator local_58;
  size_type local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_2;
  uchar *args_local_1;
  unsigned_short *args_local;
  char *format_local;
  Formatter *this_local;
  
  this_00 = this->printer_;
  local_c0 = &local_b8;
  local_30 = args_2;
  args_local_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1;
  args_local_1 = (uchar *)args;
  args_local = (unsigned_short *)format;
  format_local = (char *)this;
  ToString<unsigned_short,void>(local_c0,(Formatter *)(ulong)*args,(unsigned_short)args);
  local_c0 = &local_98;
  ToString<unsigned_char,void>(local_c0,(Formatter *)(ulong)(byte)args_local_2->_M_dataplus,x);
  local_c0 = &local_78;
  ToString(local_c0,local_30);
  local_58 = &local_b8;
  local_50 = 3;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(local_cd);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l,local_cd);
  io::Printer::FormatInternal(this_00,&local_48,&this->vars_,(char *)args_local);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(local_cd);
  local_f0 = (string *)&local_58;
  do {
    local_f0 = local_f0 + -1;
    std::__cxx11::string::~string((string *)local_f0);
  } while (local_f0 != &local_b8);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }